

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O3

RectangleNode * rengine::RectangleNode::create(void)

{
  undefined1 *puVar1;
  RectangleNode *pRVar2;
  
  if (__allocation_pool_rengine_RectangleNode.m_nextFree <
      __allocation_pool_rengine_RectangleNode.m_poolSize) {
    pRVar2 = AllocationPool<rengine::RectangleNode>::allocate
                       (&__allocation_pool_rengine_RectangleNode);
    puVar1 = &(pRVar2->super_RectangleNodeBase).super_Node.field_0x31;
    *puVar1 = *puVar1 | 2;
  }
  else {
    pRVar2 = (RectangleNode *)operator_new(0x58);
    (pRVar2->super_RectangleNodeBase).super_Node.super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    (pRVar2->super_RectangleNodeBase).super_Node.m_parent = (Node *)0x0;
    (pRVar2->super_RectangleNodeBase).super_Node.m_child = (Node *)0x0;
    (pRVar2->super_RectangleNodeBase).super_Node.m_next = (Node *)0x0;
    (pRVar2->super_RectangleNodeBase).super_Node.m_prev = (Node *)0x0;
    *(undefined4 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x30 = 0x41;
    *(undefined8 *)&(pRVar2->super_RectangleNodeBase).super_Node.field_0x34 = 0;
    *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x3c = 0;
    (pRVar2->super_RectangleNodeBase).super_Node.super_SignalEmitter._vptr_SignalEmitter =
         (_func_int **)&PTR__Node_00136c28;
    *(undefined8 *)&(pRVar2->super_RectangleNodeBase).field_0x44 = 0;
    *(undefined8 *)&pRVar2->field_0x4c = 0;
  }
  return pRVar2;
}

Assistant:

static RectangleNode *create(rect2d geometry, vec4 color = vec4()) {
        auto node = create();
        node->setGeometry(geometry);
        node->setColor(color);
        return node;
    }